

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_poly_vector.h
# Opt level: O3

void __thiscall Cookie::~Cookie(Cookie *this)

{
  ostream *poVar1;
  
  if (this->cookie != 0xdeadbeef) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"cookie value was ",0x11);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    if (this->cookie != 0xdeadbeef) {
      __assert_fail("cookie == constructed_cookie",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fecjanky[P]poly_vector/test/include/test_poly_vector.h"
                    ,0x35,"Cookie::~Cookie()");
    }
  }
  this->cookie = 0;
  return;
}

Assistant:

~Cookie()
    {
        if (cookie != constructed_cookie) {
            std::cerr << "cookie value was " << cookie << std::endl;
        }
        assert(cookie == constructed_cookie);
        cookie = 0;
    }